

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O0

int Mio_ParseCheckFormula(Mio_Gate_t *pGate,char *pForm)

{
  int iVar1;
  Mio_Pin_t *pMVar2;
  char *__s1;
  int local_b8 [2];
  int fVisit [32];
  int iPin;
  int i;
  char *pStr;
  Mio_Pin_t *pPin;
  char *pForm_local;
  Mio_Gate_t *pGate_local;
  
  pPin = (Mio_Pin_t *)pForm;
  pForm_local = (char *)pGate;
  memset(local_b8,0,0x80);
  pMVar2 = Mio_GateReadPins((Mio_Gate_t *)pForm_local);
  if (pMVar2 != (Mio_Pin_t *)0x0) {
    pMVar2 = Mio_GateReadPins((Mio_Gate_t *)pForm_local);
    __s1 = Mio_PinReadName(pMVar2);
    iVar1 = strcmp(__s1,"*");
    if (iVar1 != 0) {
      _iPin = pPin;
      do {
        if (*(char *)&_iPin->pName == '\0') {
          pStr = (char *)Mio_GateReadPins((Mio_Gate_t *)pForm_local);
          fVisit[0x1f] = 0;
          while( true ) {
            if (pStr == (char *)0x0) {
              return 1;
            }
            if (fVisit[(long)fVisit[0x1f] + -2] == 0) break;
            pStr = (char *)Mio_PinReadNext((Mio_Pin_t *)pStr);
            fVisit[0x1f] = fVisit[0x1f] + 1;
          }
          return 0;
        }
        if (((((*(char *)&_iPin->pName != ' ') && (*(char *)&_iPin->pName != '(')) &&
             (*(char *)&_iPin->pName != ')')) &&
            ((((*(char *)&_iPin->pName != '0' && (*(char *)&_iPin->pName != '1')) &&
              ((*(char *)&_iPin->pName != '!' &&
               ((*(char *)&_iPin->pName != '\'' && (*(char *)&_iPin->pName != '*')))))) &&
             (*(char *)&_iPin->pName != '&')))) &&
           (((*(char *)&_iPin->pName != '^' && (*(char *)&_iPin->pName != '+')) &&
            (*(char *)&_iPin->pName != '|')))) {
          fVisit[0x1e] = Mio_ParseCheckName((Mio_Gate_t *)pForm_local,(char **)&iPin);
          if (fVisit[0x1e] == -1) {
            printf("Skipping gate \"%s\" because substring \"%s\" does not match with a pin name.\n"
                   ,*(undefined8 *)pForm_local,_iPin);
            return 0;
          }
          if (0x1f < fVisit[0x1e]) {
            __assert_fail("iPin < 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioParse.c"
                          ,0x1e5,"int Mio_ParseCheckFormula(Mio_Gate_t *, char *)");
          }
          fVisit[(long)fVisit[0x1e] + -2] = 1;
        }
        _iPin = (Mio_Pin_t *)((long)&_iPin->pName + 1);
      } while( true );
    }
  }
  return 1;
}

Assistant:

int Mio_ParseCheckFormula( Mio_Gate_t * pGate, char * pForm )
{
    Mio_Pin_t * pPin;
    char * pStr;
    int i, iPin, fVisit[32] = {0};
    if ( Mio_GateReadPins(pGate) == NULL || !strcmp(Mio_PinReadName(Mio_GateReadPins(pGate)), "*") )
        return 1;
/*
    // find the equality sign
    pForm = strstr( pForm, "=" );
    if ( pForm == NULL )
    {
        printf( "Skipping gate \"%s\" because formula \"%s\" has not equality sign (=).\n", pGate->pName, pForm );
        return 0;
    }
*/
//printf( "Checking gate %s\n", pGate->pName );

    for ( pStr = pForm; *pStr; pStr++ )
    {
        if ( *pStr == ' ' ||
             *pStr == MIO_EQN_SYM_OPEN ||   
             *pStr == MIO_EQN_SYM_CLOSE ||  
             *pStr == MIO_EQN_SYM_CONST0 || 
             *pStr == MIO_EQN_SYM_CONST1 || 
             *pStr == MIO_EQN_SYM_NEG ||    
             *pStr == MIO_EQN_SYM_NEGAFT || 
             *pStr == MIO_EQN_SYM_AND ||    
             *pStr == MIO_EQN_SYM_AND2 ||   
             *pStr == MIO_EQN_SYM_XOR ||    
             *pStr == MIO_EQN_SYM_OR ||     
             *pStr == MIO_EQN_SYM_OR2 
           )
           continue;
        // return the number of the pin which has this name
        iPin = Mio_ParseCheckName( pGate, &pStr );
        if ( iPin == -1 )
        {
            printf( "Skipping gate \"%s\" because substring \"%s\" does not match with a pin name.\n", pGate->pName, pStr );
            return 0;
        }
        assert( iPin < 32 );
        fVisit[iPin] = 1;
    }
    // check that all pins are used
    for ( pPin = Mio_GateReadPins(pGate), i = 0; pPin; pPin = Mio_PinReadNext(pPin), i++ )
        if ( fVisit[i] == 0 )
        {
//            printf( "Skipping gate \"%s\" because pin \"%s\" does not appear in the formula \"%s\".\n", pGate->pName, Mio_PinReadName(pPin), pForm );
            return 0;
        }
    return 1;
}